

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_cursor.c
# Opt level: O2

_Bool ts_tree_cursor_child_iterator_next
                (CursorChildIterator *self,TreeCursorEntry *result,_Bool *visible)

{
  Subtree *pSVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SubtreeHeapData *pSVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  _Bool _Var7;
  uint uVar8;
  Subtree self_00;
  Length LVar9;
  Length len2;
  
  pSVar4 = (self->parent).ptr;
  if (pSVar4 != (SubtreeHeapData *)0x0) {
    uVar8 = self->child_index;
    if (uVar8 != pSVar4->child_count) {
      pSVar1 = (pSVar4->field_17).field_0.children + uVar8;
      uVar2 = (self->position).extent.column;
      uVar5 = (self->position).bytes;
      uVar6 = (self->position).extent.row;
      uVar3 = self->structural_child_index;
      result->subtree = pSVar1;
      (result->position).extent.column = uVar2;
      (result->position).bytes = uVar5;
      (result->position).extent.row = uVar6;
      result->child_index = uVar8;
      result->structural_child_index = uVar3;
      pSVar4 = pSVar1->ptr;
      if (((ulong)pSVar4 & 1) == 0) {
        uVar8 = (uint)*(ushort *)&pSVar4->field_0x2c;
      }
      else {
        uVar8 = (uint)((ulong)pSVar4 >> 1) & 0x7fffffff;
      }
      *visible = SUB41(uVar8 & 1,0);
      self_00 = *pSVar1;
      _Var7 = ts_subtree_extra(self_00);
      if ((!_Var7) && (self->alias_sequence != (TSSymbol *)0x0)) {
        *visible = (short)(uVar8 & 1) != 0 ||
                   self->alias_sequence[self->structural_child_index] != 0;
        self_00 = *pSVar1;
      }
      LVar9 = ts_subtree_size(self_00);
      LVar9 = length_add(self->position,LVar9);
      self->position = LVar9;
      uVar8 = self->child_index + 1;
      self->child_index = uVar8;
      if (!_Var7) {
        self->structural_child_index = self->structural_child_index + 1;
      }
      if (((self->parent).ptr)->child_count <= uVar8) {
        return true;
      }
      len2 = ts_subtree_padding((((self->parent).ptr)->field_17).field_0.children[uVar8]);
      LVar9 = length_add(LVar9,len2);
      self->position = LVar9;
      return true;
    }
  }
  return false;
}

Assistant:

static inline bool ts_tree_cursor_child_iterator_next(CursorChildIterator *self,
                                                      TreeCursorEntry *result,
                                                      bool *visible) {
  if (!self->parent.ptr || self->child_index == self->parent.ptr->child_count) return false;
  const Subtree *child = &self->parent.ptr->children[self->child_index];
  *result = (TreeCursorEntry) {
    .subtree = child,
    .position = self->position,
    .child_index = self->child_index,
    .structural_child_index = self->structural_child_index,
  };
  *visible = ts_subtree_visible(*child);
  bool extra = ts_subtree_extra(*child);
  if (!extra && self->alias_sequence) {
    *visible |= self->alias_sequence[self->structural_child_index];
  }

  self->position = length_add(self->position, ts_subtree_size(*child));
  self->child_index++;
  if (!extra) self->structural_child_index++;

  if (self->child_index < self->parent.ptr->child_count) {
    Subtree next_child = self->parent.ptr->children[self->child_index];
    self->position = length_add(self->position, ts_subtree_padding(next_child));
  }

  return true;
}